

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O0

Option * __thiscall
CLI::App::set_version_flag
          (App *this,string *flag_name,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
          *vfunc,string *version_help)

{
  ulong uVar1;
  Option *pOVar2;
  string local_b8;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  local_88;
  function<void_()> local_68;
  string local_48;
  string *local_28;
  string *version_help_local;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  *vfunc_local;
  string *flag_name_local;
  App *this_local;
  
  local_28 = version_help;
  version_help_local = (string *)vfunc;
  vfunc_local = (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                 *)flag_name;
  flag_name_local = (string *)this;
  if (this->version_ptr_ != (Option *)0x0) {
    remove_option(this,this->version_ptr_);
    this->version_ptr_ = (Option *)0x0;
  }
  uVar1 = ::std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    ::std::__cxx11::string::string((string *)&local_48,(string *)flag_name);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    function(&local_88,vfunc);
    ::std::function<void()>::
    function<CLI::App::set_version_flag(std::__cxx11::string,std::function<std::__cxx11::string()>,std::__cxx11::string_const&)::_lambda()_1_,void>
              ((function<void()> *)&local_68,(anon_class_32_1_a8c8e75a *)&local_88);
    ::std::__cxx11::string::string((string *)&local_b8,(string *)local_28);
    pOVar2 = add_flag_callback(this,&local_48,&local_68,&local_b8);
    this->version_ptr_ = pOVar2;
    ::std::__cxx11::string::~string((string *)&local_b8);
    std::function<void_()>::~function(&local_68);
    set_version_flag(std::__cxx11::string,std::function<std::__cxx11::string()>,std::__cxx11::string_const&)
    ::{lambda()#1}::~function((_lambda___1_ *)&local_88);
    ::std::__cxx11::string::~string((string *)&local_48);
    OptionBase<CLI::Option>::configurable(&this->version_ptr_->super_OptionBase<CLI::Option>,false);
  }
  return this->version_ptr_;
}

Assistant:

CLI11_INLINE Option *
App::set_version_flag(std::string flag_name, std::function<std::string()> vfunc, const std::string &version_help) {
    if(version_ptr_ != nullptr) {
        remove_option(version_ptr_);
        version_ptr_ = nullptr;
    }

    // Empty name will simply remove the version flag
    if(!flag_name.empty()) {
        version_ptr_ =
            add_flag_callback(flag_name, [vfunc]() { throw(CLI::CallForVersion(vfunc(), 0)); }, version_help);
        version_ptr_->configurable(false);
    }

    return version_ptr_;
}